

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicSemaphoreTests.cpp
# Opt level: O2

TestCaseGroup * vkt::synchronization::createBasicSemaphoreTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> basicTests;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"semaphore","Basic semaphore tests");
  basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"one_queue",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Basic semaphore tests with one queue",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::basicOneQueueCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"multi_queue",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Basic semaphore tests with multi queue",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::basicMultiQueueCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&basicTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createBasicSemaphoreTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicTests(new tcu::TestCaseGroup(testCtx, "semaphore", "Basic semaphore tests"));
	addFunctionCase(basicTests.get(), "one_queue",   "Basic semaphore tests with one queue",   basicOneQueueCase);
	addFunctionCase(basicTests.get(), "multi_queue", "Basic semaphore tests with multi queue", basicMultiQueueCase);

	return basicTests.release();
}